

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O1

void __thiscall Refal2::CArbitraryInteger::GetTextValue(CArbitraryInteger *this,string *text)

{
  char cVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  pointer puVar5;
  pointer puVar6;
  CArbitraryInteger tmp;
  CArbitraryInteger decimal;
  ostringstream stringStream;
  undefined1 auStack_238 [8];
  CArbitraryInteger *local_230;
  CArbitraryInteger local_228;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  CArbitraryInteger local_1e8;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  puVar6 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while ((puVar6 != puVar5 && (puVar5 = puVar5 + -1, *puVar5 == 0))) {
    (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar5;
  }
  puVar5 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = (long)puVar5 - (long)puVar6 >> 2;
  for (; (puVar5 != puVar6 && (puVar5[-1] == 0)); puVar5 = puVar5 + -1) {
    lVar3 = lVar3 + -1;
  }
  local_230 = this;
  if (lVar3 == 0) {
    std::__cxx11::string::_M_replace((ulong)text,0,(char *)text->_M_string_length,0x136aed);
    return;
  }
  text->_M_string_length = 0;
  *(text->_M_dataplus)._M_p = '\0';
  local_228.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_228.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_228.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_228.isNegative = false;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_228,
             (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  local_228.isNegative = this->isNegative;
  while( true ) {
    lVar3 = (long)local_228.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_228.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    for (puVar6 = local_228.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        (puVar6 != local_228.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start && (puVar6[-1] == 0)); puVar6 = puVar6 + -1) {
      lVar3 = lVar3 + -1;
    }
    if (lVar3 == 0) break;
    CArbitraryInteger(&local_1e8,10000000);
    Div(&local_228,&local_1e8);
    if ((long)local_1e8.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_1e8.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != 4) {
      __assert_fail("decimal.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                    ,0x73,"void Refal2::CArbitraryInteger::GetTextValue(std::string &) const");
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    *(undefined8 *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18))
         = 7;
    lVar3 = *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18);
    if (acStack_c8[lVar3 + 1] == '\0') {
      cVar1 = std::ios::widen((char)auStack_238 + (char)lVar3 + -0x70);
      acStack_c8[lVar3] = cVar1;
      acStack_c8[lVar3 + 1] = '\x01';
    }
    acStack_c8[lVar3] = '0';
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_1c8,(ulong)(text->_M_dataplus)._M_p);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_1f8 = *plVar4;
      lStack_1f0 = plVar2[3];
      local_208 = &local_1f8;
    }
    else {
      local_1f8 = *plVar4;
      local_208 = (long *)*plVar2;
    }
    local_200 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)text,(string *)&local_208);
    if (local_208 != &local_1f8) {
      operator_delete(local_208);
    }
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0]);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if (local_1e8.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  std::__cxx11::string::find_first_not_of((char)text,0x30);
  std::__cxx11::string::erase((ulong)text,0);
  if (local_230->isNegative == true) {
    std::operator+(local_1a8,"-",text);
    std::__cxx11::string::operator=((string *)text,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p);
    }
  }
  if (local_228.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CArbitraryInteger::GetTextValue( std::string& text ) const
{
	const_cast<CArbitraryInteger&>( *this ).removeLeadingZeros();
	if( IsZero() ) {
		text = "0";
		return;
	}
	text.clear();
	CArbitraryInteger tmp;
	Copy( tmp );
	while( !tmp.IsZero() ) {
		CArbitraryInteger decimal( 10000000 );
		tmp.Div( decimal );
		assert( decimal.size() == 1 );
		std::ostringstream stringStream;
		stringStream << std::setw( 7 ) << std::setfill( '0' ) << decimal[0];
		text = stringStream.str() + text;
	}
	text.erase( 0, text.find_first_not_of( '0' ) );
	if( IsNegative() ) {
		text = "-" + text;
	}
}